

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::init
          (SSBOBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  value_type vVar2;
  code *pcVar3;
  deUint32 dVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  deUint32 extraout_var;
  char *str;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  int local_7c;
  int bufNdx_1;
  value_type local_68;
  int local_58;
  int bufNdx;
  allocator<unsigned_int> local_45;
  value_type_conflict4 local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  undefined1 local_28 [8];
  Random rnd;
  Functions *gl;
  SSBOBindingRenderCase *this_local;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
  rnd.m_rnd.z = (*pRVar5->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  de::Random::Random((Random *)local_28,dVar4 ^ 0xff23a4);
  iVar1 = (this->super_LayoutBindingRenderCase).m_numBindings;
  local_44 = 0;
  std::allocator<unsigned_int>::allocator(&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_40,(long)iVar1,&local_44,&local_45);
  this_00 = &this->m_buffers;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_45);
  pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x6c8);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  (*pcVar3)(sVar6 & 0xffffffff,pvVar7);
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
    if ((int)sVar6 <= iVar1) break;
    getRandomColor((anon_unknown_1 *)&local_68,(Random *)local_28);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&this->m_expectedColors,&local_68);
    getRandomColor((anon_unknown_1 *)&stack0xffffffffffffff88,(Random *)local_28);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&this->m_expectedColors,(value_type *)&stack0xffffffffffffff88);
    local_58 = local_58 + 1;
  }
  local_7c = 0;
  while( true ) {
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
    if ((int)sVar6 <= local_7c) break;
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x40);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_buffers,(long)local_7c);
    (*pcVar3)(0x90d2,*pvVar7);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x150);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_expectedColors,(long)(local_7c * 2));
    (*pcVar3)(0x90d2,0x20,pvVar8,0x88e4);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x48);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingRenderCase).m_bindings,(long)local_7c);
    vVar2 = *pvVar9;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_buffers,(long)local_7c);
    (*pcVar3)(0x90d2,vVar2,*pvVar7);
    local_7c = local_7c + 1;
  }
  dVar4 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar4,"SSBO setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x7b6);
  de::Random::~Random((Random *)local_28);
  return extraout_EAX;
}

Assistant:

void SSBOBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();

	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);

	// Initialize SSBOs and related data
	m_buffers = std::vector<glw::GLuint>(m_numBindings, 0);
	gl.genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]);

	for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
	{
		m_expectedColors.push_back(getRandomColor(rnd));
		m_expectedColors.push_back(getRandomColor(rnd));
	}

	for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffers[bufNdx]);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, 2*sizeof(Vec4), &(m_expectedColors[2*bufNdx]), GL_STATIC_DRAW);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, m_bindings[bufNdx], m_buffers[bufNdx]);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "SSBO setup failed");
}